

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarfproc.cc
# Opt level: O3

ProcessLocation * __thiscall
pstack::Procman::StackFrame::scopeIP
          (ProcessLocation *__return_storage_ptr__,StackFrame *this,Process *proc)

{
  FDE *pFVar1;
  Addr address_;
  ProcessLocation local_40;
  
  address_ = (this->regs).rip;
  if (address_ == 0) {
    address_ = 0;
  }
  else if ((this->mechanism != MACHINEREGS) && (this->isSignalTrampoline != true)) {
    ProcessLocation::ProcessLocation(&local_40,proc,address_);
    if ((local_40.codeloc.
         super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (CodeLocation *)0x0) &&
       (((pFVar1 = CodeLocation::fde(local_40.codeloc.
                                     super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr), pFVar1 != (FDE *)0x0 &&
         (*(long *)(pFVar1 + 0x20) != 0)) && (*(char *)(*(long *)(pFVar1 + 0x20) + 0xd) == '\x01')))
       ) {
      __return_storage_ptr__->location_ = local_40.location_;
      (__return_storage_ptr__->codeloc).
      super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_40.codeloc.
           super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (__return_storage_ptr__->codeloc).
      super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_40.codeloc.
              super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      return __return_storage_ptr__;
    }
    ProcessLocation::ProcessLocation(__return_storage_ptr__,proc,address_ - 1);
    if (local_40.codeloc.
        super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return __return_storage_ptr__;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.codeloc.
               super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    return __return_storage_ptr__;
  }
  ProcessLocation::ProcessLocation(__return_storage_ptr__,proc,address_);
  return __return_storage_ptr__;
}

Assistant:

ProcessLocation
StackFrame::scopeIP(Process &proc) const
{
    // For a return address on the stack, it normally represents the next
    // instruction after a call. For functions that don't return, this might
    // land outside the caller function - so we subtract one, putting us in the
    // middle of the call instruction. This will also improve source line
    // details, as the actual return address is likely on the line of code
    // *after* the call rather than at it.
    //
    // There are two exceptions: first, the instruction pointer we grab from
    // the process's register state - this is the currently executing
    // instruction, so accurately reflects the position in the top stack frame.
    //
    // The other is for signal trampolines - In this case, the return address
    // has been synthesized to be the entrypoint of a function (eg,
    // __restore_rt) to handle return from the signal handler, and will be the
    // first instruction in the function - there's no previous call instruction
    // to point at, so we use it directly.
    auto raw = rawIP();
    if (raw == 0)
       return { proc, raw };
    if (mechanism == UnwindMechanism::MACHINEREGS)
       return { proc, raw };
    if (isSignalTrampoline)
       return { proc, raw };
    ProcessLocation location(proc, raw);

    const auto *lcie = location.cie();
    if (lcie != nullptr && lcie->isSignalHandler)
       return location;
    return {proc, raw - 1};
}